

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O3

void __thiscall
phyr::Film::Film(Film *this,Point2i *resolution,Bounds2f *cropWindow,
                unique_ptr<phyr::Filter,_std::default_delete<phyr::Filter>_> *_filter,
                double filmSize,string *filename,double scale)

{
  undefined8 *puVar1;
  pointer pcVar2;
  Filter *pFVar3;
  double dVar4;
  int iVar5;
  Point2<int> PVar6;
  long lVar7;
  long lVar8;
  Pixel *pPVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  Point2<int> PVar15;
  long lVar16;
  int iVar17;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined1 local_48 [16];
  
  this->resolution = *resolution;
  this->filmSize = filmSize * 0.001;
  (this->filter)._M_t.super___uniq_ptr_impl<phyr::Filter,_std::default_delete<phyr::Filter>_>._M_t.
  super__Tuple_impl<0UL,_phyr::Filter_*,_std::default_delete<phyr::Filter>_>.
  super__Head_base<0UL,_phyr::Filter_*,_false>._M_head_impl =
       (_filter->_M_t).super___uniq_ptr_impl<phyr::Filter,_std::default_delete<phyr::Filter>_>._M_t.
       super__Tuple_impl<0UL,_phyr::Filter_*,_std::default_delete<phyr::Filter>_>.
       super__Head_base<0UL,_phyr::Filter_*,_false>._M_head_impl;
  (_filter->_M_t).super___uniq_ptr_impl<phyr::Filter,_std::default_delete<phyr::Filter>_>._M_t.
  super__Tuple_impl<0UL,_phyr::Filter_*,_std::default_delete<phyr::Filter>_>.
  super__Head_base<0UL,_phyr::Filter_*,_false>._M_head_impl = (Filter *)0x0;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar2 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename,pcVar2,pcVar2 + filename->_M_string_length);
  (this->croppedImageBounds).pMin.x = -0x80000000;
  (this->croppedImageBounds).pMin.y = -0x80000000;
  (this->croppedImageBounds).pMax.x = 0x7fffffff;
  (this->croppedImageBounds).pMax.y = 0x7fffffff;
  this->scale = scale;
  (this->pixels)._M_t.
  super___uniq_ptr_impl<phyr::Film::Pixel,_std::default_delete<phyr::Film::Pixel[]>_>._M_t.
  super__Tuple_impl<0UL,_phyr::Film::Pixel_*,_std::default_delete<phyr::Film::Pixel[]>_>.
  super__Head_base<0UL,_phyr::Film::Pixel_*,_false>._M_head_impl = (Pixel *)0x0;
  (this->mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  iVar17 = resolution->x;
  dVar4 = ceil((cropWindow->pMin).x * (double)iVar17);
  iVar12 = (int)dVar4;
  iVar10 = resolution->y;
  dVar4 = ceil((cropWindow->pMin).y * (double)iVar10);
  iVar13 = (int)dVar4;
  dVar4 = ceil((double)iVar17 * (cropWindow->pMax).x);
  iVar14 = (int)dVar4;
  dVar4 = ceil((double)iVar10 * (cropWindow->pMax).y);
  iVar10 = (int)dVar4;
  iVar17 = iVar12;
  if (iVar14 < iVar12) {
    iVar17 = iVar14;
  }
  iVar5 = iVar13;
  if (iVar10 < iVar13) {
    iVar5 = iVar10;
  }
  PVar6.y = iVar5;
  PVar6.x = iVar17;
  iVar17 = iVar14;
  if (iVar14 < iVar12) {
    iVar17 = iVar12;
  }
  iVar5 = iVar10;
  if (iVar10 < iVar13) {
    iVar5 = iVar13;
  }
  PVar15.y = iVar5;
  PVar15.x = iVar17;
  (this->croppedImageBounds).pMin = PVar6;
  (this->croppedImageBounds).pMax = PVar15;
  lVar7 = (long)iVar12 - (long)iVar14;
  lVar16 = -lVar7;
  if (0 < lVar7) {
    lVar16 = lVar7;
  }
  lVar8 = (long)iVar13 - (long)iVar10;
  lVar7 = -lVar8;
  if (0 < lVar8) {
    lVar7 = lVar8;
  }
  iVar17 = (int)lVar7 * (int)lVar16;
  uVar11 = 0xffffffffffffffff;
  if (-1 < iVar17) {
    uVar11 = (long)iVar17 << 6;
  }
  pPVar9 = (Pixel *)operator_new__(uVar11);
  if (iVar17 != 0) {
    uVar11 = 0;
    do {
      puVar1 = (undefined8 *)((long)pPVar9->xyz + uVar11 + 0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)pPVar9->xyz + uVar11 + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)pPVar9->xyz + uVar11);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)pPVar9->xyz + uVar11 + 0x30) = 0;
      uVar11 = uVar11 + 0x40;
    } while ((long)iVar17 << 6 != uVar11);
  }
  (this->pixels)._M_t.
  super___uniq_ptr_impl<phyr::Film::Pixel,_std::default_delete<phyr::Film::Pixel[]>_>._M_t.
  super__Tuple_impl<0UL,_phyr::Film::Pixel_*,_std::default_delete<phyr::Film::Pixel[]>_>.
  super__Head_base<0UL,_phyr::Film::Pixel_*,_false>._M_head_impl = pPVar9;
  iVar17 = 0;
  lVar16 = 0;
  do {
    lVar7 = 0;
    do {
      pFVar3 = (this->filter)._M_t.
               super___uniq_ptr_impl<phyr::Filter,_std::default_delete<phyr::Filter>_>._M_t.
               super__Tuple_impl<0UL,_phyr::Filter_*,_std::default_delete<phyr::Filter>_>.
               super__Head_base<0UL,_phyr::Filter_*,_false>._M_head_impl;
      dVar4 = (pFVar3->radius).y * ((double)iVar17 + 0.5) * 0.0625;
      local_48._8_4_ = SUB84(dVar4,0);
      local_48._0_8_ = (pFVar3->radius).x * ((double)(int)lVar7 + 0.5) * 0.0625;
      local_48._12_4_ = (int)((ulong)dVar4 >> 0x20);
      (*pFVar3->_vptr_Filter[2])(pFVar3,local_48);
      this->filterTable[(int)lVar16 + lVar7] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 0x10);
    iVar17 = iVar17 + 1;
    lVar16 = (int)lVar16 + lVar7;
  } while (iVar17 != 0x10);
  return;
}

Assistant:

Film::Film(const Point2i& resolution, const Bounds2f& cropWindow,
           std::unique_ptr<Filter> _filter, Real filmSize,
           const std::string& filename, Real scale) :
    resolution(resolution), filmSize(filmSize * .001), filter(std::move(_filter)),
    filename(filename), scale(scale) {
    // Compute film image bounds
    croppedImageBounds = Bounds2i(Point2i(std::ceil(resolution.x * cropWindow.pMin.x),
                                          std::ceil(resolution.y * cropWindow.pMin.y)),
                                  Point2i(std::ceil(resolution.x * cropWindow.pMax.x),
                                          std::ceil(resolution.y * cropWindow.pMax.y)));

    // Allocate memory for image pixels
    pixels = std::unique_ptr<Pixel[]>(new Pixel[croppedImageBounds.area()]);

    // Precompute filter weight table
    Real invFilterTableSize = Real(1) / filterTableSize;
    int offset = 0;

    for (int y = 0; y < filterTableSize; y++) {
        for (int x = 0; x < filterTableSize; x++) {
            Real px, py;
            px = (x + 0.5) * filter->radius.x * invFilterTableSize;
            py = (y + 0.5) * filter->radius.y * invFilterTableSize;
            filterTable[offset++] = filter->evaluate(Point2f(px, py));
        }
    }
}